

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O1

ze_result_t zesGetDeviceProcAddrTable(ze_api_version_t version,zes_device_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  int iVar3;
  ze_result_t zVar4;
  code *UNRECOVERED_JUMPTABLE;
  iterator __begin1;
  undefined8 *puVar5;
  bool bVar6;
  
  puVar5 = (undefined8 *)**(long **)(loader::context + 0x1610);
  puVar1 = (undefined8 *)(*(long **)(loader::context + 0x1610))[1];
  if (puVar1 != puVar5) {
    if (pDdiTable == (zes_device_dditable_t *)0x0) {
      return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    if (*(int *)(loader::context + 0x15c0) < (int)version) {
      return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    }
    bVar6 = false;
    for (; puVar5 != puVar1; puVar5 = puVar5 + 0x1b3) {
      if ((*(int *)(puVar5 + 1) == 0) &&
         (UNRECOVERED_JUMPTABLE = (code *)dlsym(*puVar5,"zesGetDeviceProcAddrTable"),
         UNRECOVERED_JUMPTABLE != (code *)0x0)) {
        iVar3 = (*UNRECOVERED_JUMPTABLE)(version,puVar5 + 0x114);
        if (iVar3 == 0) {
          bVar6 = true;
        }
        else {
          *(int *)(puVar5 + 1) = iVar3;
        }
      }
    }
    if (!bVar6) {
      return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    lVar2 = **(long **)(loader::context + 0x1610);
    if (((ulong)(((*(long **)(loader::context + 0x1610))[1] - lVar2 >> 3) * 0x7aff6957aff6957b) < 2)
       && (*(char *)(loader::context + 0x1629) != '\x01')) {
      memcpy(pDdiTable,(void *)(lVar2 + 0x8a0),0x128);
    }
    else {
      pDdiTable->pfnGetProperties = loader::zesDeviceGetProperties;
      pDdiTable->pfnGetState = loader::zesDeviceGetState;
      pDdiTable->pfnReset = loader::zesDeviceReset;
      pDdiTable->pfnProcessesGetState = loader::zesDeviceProcessesGetState;
      pDdiTable->pfnPciGetProperties = loader::zesDevicePciGetProperties;
      pDdiTable->pfnPciGetState = loader::zesDevicePciGetState;
      pDdiTable->pfnPciGetBars = loader::zesDevicePciGetBars;
      pDdiTable->pfnPciGetStats = loader::zesDevicePciGetStats;
      pDdiTable->pfnEnumDiagnosticTestSuites = loader::zesDeviceEnumDiagnosticTestSuites;
      pDdiTable->pfnEnumEngineGroups = loader::zesDeviceEnumEngineGroups;
      pDdiTable->pfnEventRegister = loader::zesDeviceEventRegister;
      pDdiTable->pfnEnumFabricPorts = loader::zesDeviceEnumFabricPorts;
      pDdiTable->pfnEnumFans = loader::zesDeviceEnumFans;
      pDdiTable->pfnEnumFirmwares = loader::zesDeviceEnumFirmwares;
      pDdiTable->pfnEnumFrequencyDomains = loader::zesDeviceEnumFrequencyDomains;
      pDdiTable->pfnEnumLeds = loader::zesDeviceEnumLeds;
      pDdiTable->pfnEnumMemoryModules = loader::zesDeviceEnumMemoryModules;
      pDdiTable->pfnEnumPerformanceFactorDomains = loader::zesDeviceEnumPerformanceFactorDomains;
      pDdiTable->pfnEnumPowerDomains = loader::zesDeviceEnumPowerDomains;
      pDdiTable->pfnGetCardPowerDomain = loader::zesDeviceGetCardPowerDomain;
      pDdiTable->pfnEnumPsus = loader::zesDeviceEnumPsus;
      pDdiTable->pfnEnumRasErrorSets = loader::zesDeviceEnumRasErrorSets;
      pDdiTable->pfnEnumSchedulers = loader::zesDeviceEnumSchedulers;
      pDdiTable->pfnEnumStandbyDomains = loader::zesDeviceEnumStandbyDomains;
      pDdiTable->pfnEnumTemperatureSensors = loader::zesDeviceEnumTemperatureSensors;
      pDdiTable->pfnEccAvailable = loader::zesDeviceEccAvailable;
      pDdiTable->pfnEccConfigurable = loader::zesDeviceEccConfigurable;
      pDdiTable->pfnGetEccState = loader::zesDeviceGetEccState;
      pDdiTable->pfnSetEccState = loader::zesDeviceSetEccState;
      pDdiTable->pfnGet = loader::zesDeviceGet;
      pDdiTable->pfnSetOverclockWaiver = loader::zesDeviceSetOverclockWaiver;
      pDdiTable->pfnGetOverclockDomains = loader::zesDeviceGetOverclockDomains;
      pDdiTable->pfnGetOverclockControls = loader::zesDeviceGetOverclockControls;
      pDdiTable->pfnResetOverclockSettings = loader::zesDeviceResetOverclockSettings;
      pDdiTable->pfnReadOverclockState = loader::zesDeviceReadOverclockState;
      pDdiTable->pfnEnumOverclockDomains = loader::zesDeviceEnumOverclockDomains;
      pDdiTable->pfnResetExt = loader::zesDeviceResetExt;
    }
    if (*(long *)(loader::context + 0x1618) == 0) {
      return ZE_RESULT_SUCCESS;
    }
    UNRECOVERED_JUMPTABLE =
         (code *)dlsym(*(long *)(loader::context + 0x1618),"zesGetDeviceProcAddrTable");
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      zVar4 = (*UNRECOVERED_JUMPTABLE)(version,pDdiTable);
      return zVar4;
    }
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetDeviceProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_device_dditable_t* pDdiTable                ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->sysmanInstanceDrivers->size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    bool atLeastOneDriverValid = false;
    // Load the device-driver DDI tables
    for( auto& drv : *loader::context->sysmanInstanceDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<zes_pfnGetDeviceProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zesGetDeviceProcAddrTable") );
        if(!getTable) 
            continue; 
        auto getTableResult = getTable( version, &drv.dditable.zes.Device);
        if(getTableResult == ZE_RESULT_SUCCESS) 
            atLeastOneDriverValid = true;
        else
            drv.initStatus = getTableResult;
    }

    if(!atLeastOneDriverValid)
        result = ZE_RESULT_ERROR_UNINITIALIZED;
    else
        result = ZE_RESULT_SUCCESS;

    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->sysmanInstanceDrivers->size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnGetProperties                            = loader::zesDeviceGetProperties;
            pDdiTable->pfnGetState                                 = loader::zesDeviceGetState;
            pDdiTable->pfnReset                                    = loader::zesDeviceReset;
            pDdiTable->pfnProcessesGetState                        = loader::zesDeviceProcessesGetState;
            pDdiTable->pfnPciGetProperties                         = loader::zesDevicePciGetProperties;
            pDdiTable->pfnPciGetState                              = loader::zesDevicePciGetState;
            pDdiTable->pfnPciGetBars                               = loader::zesDevicePciGetBars;
            pDdiTable->pfnPciGetStats                              = loader::zesDevicePciGetStats;
            pDdiTable->pfnEnumDiagnosticTestSuites                 = loader::zesDeviceEnumDiagnosticTestSuites;
            pDdiTable->pfnEnumEngineGroups                         = loader::zesDeviceEnumEngineGroups;
            pDdiTable->pfnEventRegister                            = loader::zesDeviceEventRegister;
            pDdiTable->pfnEnumFabricPorts                          = loader::zesDeviceEnumFabricPorts;
            pDdiTable->pfnEnumFans                                 = loader::zesDeviceEnumFans;
            pDdiTable->pfnEnumFirmwares                            = loader::zesDeviceEnumFirmwares;
            pDdiTable->pfnEnumFrequencyDomains                     = loader::zesDeviceEnumFrequencyDomains;
            pDdiTable->pfnEnumLeds                                 = loader::zesDeviceEnumLeds;
            pDdiTable->pfnEnumMemoryModules                        = loader::zesDeviceEnumMemoryModules;
            pDdiTable->pfnEnumPerformanceFactorDomains             = loader::zesDeviceEnumPerformanceFactorDomains;
            pDdiTable->pfnEnumPowerDomains                         = loader::zesDeviceEnumPowerDomains;
            pDdiTable->pfnGetCardPowerDomain                       = loader::zesDeviceGetCardPowerDomain;
            pDdiTable->pfnEnumPsus                                 = loader::zesDeviceEnumPsus;
            pDdiTable->pfnEnumRasErrorSets                         = loader::zesDeviceEnumRasErrorSets;
            pDdiTable->pfnEnumSchedulers                           = loader::zesDeviceEnumSchedulers;
            pDdiTable->pfnEnumStandbyDomains                       = loader::zesDeviceEnumStandbyDomains;
            pDdiTable->pfnEnumTemperatureSensors                   = loader::zesDeviceEnumTemperatureSensors;
            pDdiTable->pfnEccAvailable                             = loader::zesDeviceEccAvailable;
            pDdiTable->pfnEccConfigurable                          = loader::zesDeviceEccConfigurable;
            pDdiTable->pfnGetEccState                              = loader::zesDeviceGetEccState;
            pDdiTable->pfnSetEccState                              = loader::zesDeviceSetEccState;
            pDdiTable->pfnGet                                      = loader::zesDeviceGet;
            pDdiTable->pfnSetOverclockWaiver                       = loader::zesDeviceSetOverclockWaiver;
            pDdiTable->pfnGetOverclockDomains                      = loader::zesDeviceGetOverclockDomains;
            pDdiTable->pfnGetOverclockControls                     = loader::zesDeviceGetOverclockControls;
            pDdiTable->pfnResetOverclockSettings                   = loader::zesDeviceResetOverclockSettings;
            pDdiTable->pfnReadOverclockState                       = loader::zesDeviceReadOverclockState;
            pDdiTable->pfnEnumOverclockDomains                     = loader::zesDeviceEnumOverclockDomains;
            pDdiTable->pfnResetExt                                 = loader::zesDeviceResetExt;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->sysmanInstanceDrivers->front().dditable.zes.Device;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<zes_pfnGetDeviceProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zesGetDeviceProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    return result;
}